

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

void ctemplate_htmlparser::nopad_strncpy(char *dst,char *src,size_t dst_size,size_t src_size)

{
  size_t local_38;
  size_t size;
  size_t src_size_local;
  size_t dst_size_local;
  char *src_local;
  char *dst_local;
  
  local_38 = dst_size;
  if (src_size < dst_size) {
    local_38 = src_size;
  }
  strncpy(dst,src,local_38);
  if (local_38 != 0) {
    dst[local_38 - 1] = '\0';
  }
  return;
}

Assistant:

static inline void nopad_strncpy(char *dst, const char *src, size_t dst_size,
                                 size_t src_size)
{
  size_t size;

  /* size = min(dst_size, src_size) */
  size = dst_size > src_size ? src_size : dst_size;
  strncpy(dst, src, size);
  if (size > 0)
    dst[size - 1] = '\0';
}